

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

void __thiscall cmCursesMainForm::HandleInput(cmCursesMainForm *this)

{
  string *__rhs;
  short sVar1;
  cmState *pcVar2;
  uint uVar3;
  char cVar4;
  _Bool _Var5;
  __type _Var6;
  int iVar7;
  FIELD *pFVar8;
  long *plVar9;
  cmCursesLongMessageForm *pcVar10;
  long lVar11;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar15;
  FIELD **ppFVar16;
  ulong uVar17;
  ulong uVar18;
  FORM *pFVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *messages;
  pointer ppcVar20;
  int key;
  allocator local_132;
  allocator local_131;
  long *local_130;
  cmState *local_128;
  uint local_11c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_118;
  string searchstr;
  string local_d8;
  char debugMessage [128];
  
  if ((this->super_cmCursesForm).Form == (FORM *)0x0) {
switchD_00268d9a_caseD_71:
    return;
  }
  __rhs = &this->SearchString;
  local_118 = &this->HelpMessage;
  uVar17 = 0;
LAB_00268ab2:
  while( true ) {
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    PrintKeys(this,0);
    if (this->SearchMode == true) {
      std::operator+(&searchstr,"Search: ",__rhs);
      (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,searchstr._M_dataplus._M_p);
      PrintKeys(this,1);
      move((int)uVar17 + -5);
      uVar17 = 0xffffffffffffffff;
      if (_stdscr != 0) {
        uVar17 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      }
      wtouchln(_stdscr,0,uVar17,1);
      refresh();
      std::__cxx11::string::~string((string *)&searchstr);
    }
    key = wgetch(_stdscr);
    uVar17 = 0xffffffffffffffff;
    if (_stdscr != 0) break;
LAB_00268b86:
    if (key == 0x71) {
      return;
    }
  }
  sVar1 = *(short *)(_stdscr + 6);
  uVar17 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
  if (*(short *)(_stdscr + 4) < 5 || sVar1 < 0x40) goto LAB_00268b86;
  pFVar8 = current_field((this->super_cmCursesForm).Form);
  plVar9 = (long *)field_userptr(pFVar8);
  if (this->SearchMode != true) {
    if ((plVar9 == (long *)0x0) ||
       (cVar4 = (**(code **)(*plVar9 + 0x10))(plVar9,&key,this,_stdscr), cVar4 == '\0'))
    goto LAB_00268cb5;
    this->OkToGenerate = false;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
    PrintKeys(this,0);
    goto switchD_00268d9a_caseD_65;
  }
  if ((key == 0x157) || (key == 10)) {
    this->SearchMode = false;
    if ((this->SearchString)._M_string_length != 0) {
      JumpToCacheEntry(this,(this->SearchString)._M_dataplus._M_p);
      std::__cxx11::string::_M_assign((string *)&this->OldSearchString);
    }
    std::__cxx11::string::assign((char *)__rhs);
  }
  else if (((key & 0xffffffdfU) - 0x41 < 0x1a) || (key == 0x5f || key - 0x30U < 10)) {
    if ((this->SearchString)._M_string_length < (ulong)(ushort)(sVar1 - 9)) {
      std::__cxx11::string::push_back((char)__rhs);
    }
  }
  else if ((((key == 8) || (key == 0x14a)) || (key == 0x107)) &&
          ((this->SearchString)._M_string_length != 0)) {
    std::__cxx11::string::resize((ulong)__rhs);
  }
LAB_00268cb5:
  if (this->SearchMode != false) goto switchD_00268d9a_caseD_65;
  sprintf(debugMessage,"Main form handling input, key: %d",(ulong)(uint)key);
  cmCursesForm::LogMessage(debugMessage);
  switch(key) {
  case 99:
    Configure(this,0);
    break;
  case 100:
    if (this->NumberOfVisibleEntries != 0) {
      this->OkToGenerate = false;
      pFVar8 = current_field((this->super_cmCursesForm).Form);
      iVar7 = field_index(pFVar8);
      lVar11 = (long)iVar7;
      if (iVar7 == 2) {
        ppFVar16 = this->Fields;
        pFVar8 = (FIELD *)0x0;
      }
      else {
        ppFVar16 = this->Fields;
        if (this->NumberOfVisibleEntries * 3 + -1 == lVar11) {
          pFVar8 = ppFVar16[lVar11 + -5];
        }
        else {
          pFVar8 = ppFVar16[lVar11 + 1];
        }
      }
      plVar9 = (long *)field_userptr(ppFVar16[lVar11 + -2]);
      if (plVar9 != (long *)0x0) {
        pcVar2 = this->CMakeInstance->State;
        local_130 = plVar9;
        pcVar12 = (char *)(**(code **)(*plVar9 + 0x28))();
        std::__cxx11::string::string((string *)&searchstr,pcVar12,(allocator *)&local_d8);
        cmState::RemoveCacheEntry(pcVar2,&searchstr);
        std::__cxx11::string::~string((string *)&searchstr);
        searchstr._M_dataplus._M_p = (pointer)&searchstr.field_2;
        searchstr._M_string_length = 0;
        searchstr.field_2._M_local_buf[0] = '\0';
        if (pFVar8 != (FIELD *)0x0) {
          plVar9 = (long *)field_userptr(pFVar8);
          (**(code **)(*plVar9 + 0x28))(plVar9);
          std::__cxx11::string::assign((char *)&searchstr);
        }
        uVar18 = 0xffffffffffffffff;
        uVar17 = 0xffffffff;
        if (_stdscr != 0) {
          uVar17 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
          uVar18 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
        }
        pcVar12 = (char *)(**(code **)(*local_130 + 0x28))();
        RemoveEntry(this,pcVar12);
        RePost(this);
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,uVar18 & 0xffffffff,uVar17);
        if (pFVar8 != (FIELD *)0x0) {
          pvVar15 = this->Entries;
          pFVar8 = (FIELD *)0x0;
          for (ppcVar20 = (pvVar15->
                          super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                          )._M_impl.super__Vector_impl_data._M_start;
              ppcVar20 !=
              (pvVar15->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_finish; ppcVar20 = ppcVar20 + 1) {
            _Var6 = std::operator==(&searchstr,&(*ppcVar20)->Key);
            if (_Var6) {
              pFVar8 = (*ppcVar20)->Entry->Field;
            }
            pvVar15 = this->Entries;
          }
          if (pFVar8 != (FIELD *)0x0) {
            set_current_field((this->super_cmCursesForm).Form,pFVar8);
          }
        }
        std::__cxx11::string::~string((string *)&searchstr);
      }
    }
    break;
  case 0x65:
  case 0x66:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x73:
    break;
  case 0x67:
    if (this->OkToGenerate == true) {
      Generate(this);
      return;
    }
    break;
  case 0x68:
    local_11c = 0xffffffff;
    uVar17 = 0xffffffff;
    if (_stdscr != 0) {
      uVar17 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      local_11c = (int)*(short *)(_stdscr + 6) + 1;
    }
    pFVar8 = current_field((this->super_cmCursesForm).Form);
    iVar7 = field_index(pFVar8);
    plVar9 = (long *)field_userptr(this->Fields[(long)iVar7 + -2]);
    local_130 = (long *)(**(code **)(*plVar9 + 0x28))(plVar9);
    pcVar2 = this->CMakeInstance->State;
    std::__cxx11::string::string((string *)&searchstr,(char *)local_130,(allocator *)&local_d8);
    pcVar12 = cmState::GetCacheEntryValue(pcVar2,&searchstr);
    std::__cxx11::string::~string((string *)&searchstr);
    if (pcVar12 == (char *)0x0) {
LAB_00269111:
      messages = local_118;
      std::__cxx11::string::assign
                ((char *)((local_118->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1));
    }
    else {
      local_128 = this->CMakeInstance->State;
      std::__cxx11::string::string((string *)&searchstr,(char *)local_130,&local_131);
      std::__cxx11::string::string((string *)&local_d8,"HELPSTRING",&local_132);
      local_128 = (cmState *)cmState::GetCacheEntryProperty(local_128,&searchstr,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&searchstr);
      if (local_128 == (cmState *)0x0) goto LAB_00269111;
      sVar13 = strlen((char *)local_130);
      pcVar2 = local_128;
      sVar14 = strlen((char *)local_128);
      pcVar12 = (char *)operator_new__(sVar14 + sVar13 + 0x40);
      sprintf(pcVar12,"Current option is: %s\nHelp string for this option is: %s\n",local_130,pcVar2
             );
      messages = local_118;
      std::__cxx11::string::assign
                ((char *)((local_118->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1));
      operator_delete__(pcVar12);
    }
    pcVar10 = (cmCursesLongMessageForm *)operator_new(0x60);
    cmCursesLongMessageForm::cmCursesLongMessageForm(pcVar10,messages,"Help.");
    uVar3 = local_11c;
    cmCursesForm::CurrentForm = (cmCursesForm *)pcVar10;
    (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[3])(pcVar10,1,1,(ulong)local_11c,uVar17);
    (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar10);
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)uVar3,uVar17);
    pFVar19 = (this->super_cmCursesForm).Form;
LAB_0026919c:
    set_current_field(pFVar19,pFVar8);
    break;
  case 0x6c:
    uVar18 = 0xffffffffffffffff;
    uVar17 = 0xffffffff;
    if (_stdscr != 0) {
      uVar17 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      uVar18 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
    }
    pcVar10 = (cmCursesLongMessageForm *)operator_new(0x60);
    cmCursesLongMessageForm::cmCursesLongMessageForm
              (pcVar10,&this->Errors,"Errors occurred during the last pass.");
    cmCursesForm::CurrentForm = (cmCursesForm *)pcVar10;
    (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[3])(pcVar10,1,1,uVar18 & 0xffffffff,uVar17);
    (*(pcVar10->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar10);
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    goto LAB_00268ec7;
  case 0x6e:
    if ((this->OldSearchString)._M_string_length != 0) {
      JumpToCacheEntry(this,(this->OldSearchString)._M_dataplus._M_p);
    }
    break;
  case 0x71:
    goto switchD_00268d9a_caseD_71;
  case 0x74:
    this->AdvancedMode = (bool)(this->AdvancedMode ^ 1);
    uVar18 = 0xffffffffffffffff;
    uVar17 = 0xffffffff;
    if (_stdscr != 0) {
      uVar17 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
      uVar18 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
    }
    RePost(this);
LAB_00268ec7:
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,uVar18 & 0xffffffff,uVar17);
    break;
  default:
    if (key != 4) {
      if (key == 0xe) {
LAB_00268d49:
        pFVar8 = current_field((this->super_cmCursesForm).Form);
        iVar7 = field_index(pFVar8);
        if (this->NumberOfVisibleEntries * 3 + -1 != (long)iVar7) {
          _Var5 = new_page(this->Fields[(long)iVar7 + 1]);
          pFVar19 = (this->super_cmCursesForm).Form;
          if (_Var5) goto LAB_00268daf;
          iVar7 = 0x204;
          goto LAB_00268dbf;
        }
      }
      else {
        if (key != 0x10) {
          if (key != 0x15) {
            if (key == 0x2f) {
              this->SearchMode = true;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Search");
              PrintKeys(this,1);
              uVar18 = 0xffffffffffffffff;
              if (_stdscr != 0) {
                uVar18 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
              }
              wtouchln(_stdscr,0,uVar18,1);
              refresh();
            }
            else {
              if (key == 0x153) goto LAB_00268db6;
              if (key == 0x103) goto LAB_00268dc9;
              if (key == 0x152) goto LAB_00268dab;
              if (key == 0x102) goto LAB_00268d49;
            }
            break;
          }
LAB_00268db6:
          pFVar19 = (this->super_cmCursesForm).Form;
          iVar7 = 0x201;
          goto LAB_00268dbf;
        }
LAB_00268dc9:
        pFVar8 = current_field((this->super_cmCursesForm).Form);
        iVar7 = field_index(pFVar8);
        if (iVar7 != 2) {
          _Var5 = new_page(this->Fields[(long)iVar7 + -2]);
          pFVar19 = (this->super_cmCursesForm).Form;
          if (!_Var5) {
            iVar7 = 0x205;
            goto LAB_00268dbf;
          }
          form_driver(pFVar19,0x201);
          pFVar19 = (this->super_cmCursesForm).Form;
          pFVar8 = this->Fields[(long)iVar7 + -3];
          goto LAB_0026919c;
        }
      }
      goto LAB_00268ab2;
    }
LAB_00268dab:
    pFVar19 = (this->super_cmCursesForm).Form;
LAB_00268daf:
    iVar7 = 0x200;
LAB_00268dbf:
    form_driver(pFVar19,iVar7);
  }
switchD_00268d9a_caseD_65:
  uVar18 = 0xffffffffffffffff;
  if (_stdscr != 0) {
    uVar18 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
  }
  wtouchln(_stdscr,0,uVar18,1);
  wrefresh(_stdscr);
  goto LAB_00268ab2;
}

Assistant:

void cmCursesMainForm::HandleInput()
{
  int x=0,y=0;

  if (!this->Form)
    {
    return;
    }

  FIELD* currentField;
  cmCursesWidget* currentWidget;

  char debugMessage[128];

  for(;;)
    {
    this->UpdateStatusBar();
    this->PrintKeys();
    if ( this->SearchMode )
      {
      std::string searchstr = "Search: " + this->SearchString;
      this->UpdateStatusBar( searchstr.c_str() );
      this->PrintKeys(1);
      curses_move(y-5,static_cast<unsigned int>(searchstr.size()));
      //curses_move(1,1);
      touchwin(stdscr);
      refresh();
      }
    int key = getch();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if ( x < cmCursesMainForm::MIN_WIDTH  ||
         y < cmCursesMainForm::MIN_HEIGHT )
      {
      // quit
      if ( key == 'q' )
        {
        break;
        }
      else
        {
        continue;
        }
      }

    currentField = current_field(this->Form);
    currentWidget = reinterpret_cast<cmCursesWidget*>(field_userptr(
      currentField));

    bool widgetHandled=false;

    if ( this->SearchMode )
      {
      if ( key == 10 || key == KEY_ENTER )
        {
        this->SearchMode = false;
        if (!this->SearchString.empty())
          {
          this->JumpToCacheEntry(this->SearchString.c_str());
          this->OldSearchString = this->SearchString;
          }
        this->SearchString = "";
        }
      /*
      else if ( key == KEY_ESCAPE )
        {
        this->SearchMode = false;
        }
      */
      else if ((key >= 'a' && key <= 'z') ||
               (key >= 'A' && key <= 'Z') ||
               (key >= '0' && key <= '9') ||
               (key == '_' ))
        {
        if ( this->SearchString.size() < static_cast<std::string::size_type>(x-10) )
          {
          this->SearchString += static_cast<char>(key);
          }
        }
      else if ( key == ctrl('h') || key == KEY_BACKSPACE || key == KEY_DC )
        {
        if (!this->SearchString.empty())
          {
          this->SearchString.resize(this->SearchString.size()-1);
          }
        }
      }
    else if (currentWidget && !this->SearchMode)
      {
      // Ask the current widget if it wants to handle input
      widgetHandled = currentWidget->HandleInput(key, this, stdscr);
      if (widgetHandled)
        {
        this->OkToGenerate = false;
        this->UpdateStatusBar();
        this->PrintKeys();
        }
      }
    if ((!currentWidget || !widgetHandled) && !this->SearchMode)
      {
      // If the current widget does not want to handle input,
      // we handle it.
      sprintf(debugMessage, "Main form handling input, key: %d", key);
      cmCursesForm::LogMessage(debugMessage);
      // quit
      if ( key == 'q' )
        {
        break;
        }
      // if not end of page, next field otherwise next page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      else if ( key == KEY_DOWN || key == ctrl('n') )
        {
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);
        if ( findex == 3*this->NumberOfVisibleEntries-1 )
          {
          continue;
          }
        if (new_page(this->Fields[findex+1]))
          {
          form_driver(this->Form, REQ_NEXT_PAGE);
          }
        else
          {
          form_driver(this->Form, REQ_NEXT_FIELD);
          }
        }
      // if not beginning of page, previous field, otherwise previous page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      else if ( key == KEY_UP || key == ctrl('p') )
        {
        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        if ( findex == 2 )
          {
          continue;
          }
        if ( new_page(this->Fields[findex-2]) )
          {
          form_driver(this->Form, REQ_PREV_PAGE);
          set_current_field(this->Form, this->Fields[findex-3]);
          }
        else
          {
          form_driver(this->Form, REQ_PREV_FIELD);
          }
        }
      // pg down
      else if ( key == KEY_NPAGE || key == ctrl('d') )
        {
        form_driver(this->Form, REQ_NEXT_PAGE);
        }
      // pg up
      else if ( key == KEY_PPAGE || key == ctrl('u') )
        {
        form_driver(this->Form, REQ_PREV_PAGE);
        }
      // configure
      else if ( key == 'c' )
        {
        this->Configure();
        }
      // display help
      else if ( key == 'h' )
        {
        getmaxyx(stdscr, y, x);

        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(field_userptr(
          this->Fields[findex-2]));
        const char* curField = lbl->GetValue();
        const char* helpString = 0;

        const char* existingValue =
            this->CMakeInstance->GetState()
                ->GetCacheEntryValue(curField);
        if (existingValue)
          {
          helpString = this->CMakeInstance->GetState()
                           ->GetCacheEntryProperty(curField, "HELPSTRING");
          }
        if (helpString)
          {
          char* message = new char[strlen(curField)+strlen(helpString)
                                  +strlen("Current option is: \n Help string for this option is: \n")+10];
          sprintf(message,"Current option is: %s\nHelp string for this option is: %s\n", curField, helpString);
          this->HelpMessage[1] = message;
          delete[] message;
          }
        else
          {
          this->HelpMessage[1] = "";
          }

        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(this->HelpMessage,
                                                                    "Help.");
        CurrentForm = msgs;
        msgs->Render(1,1,x,y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1,1,x,y);
        set_current_field(this->Form, cur);
        }
      // display last errors
      else if ( key == 'l' )
        {
        getmaxyx(stdscr, y, x);
        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(this->Errors,
                                                                    "Errors occurred during the last pass.");
        CurrentForm = msgs;
        msgs->Render(1,1,x,y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1,1,x,y);
        }
      else if ( key == '/' )
        {
        this->SearchMode = true;
        this->UpdateStatusBar("Search");
        this->PrintKeys(1);
        touchwin(stdscr);
        refresh();
        }
      else if ( key == 'n' )
        {
        if (!this->OldSearchString.empty())
          {
          this->JumpToCacheEntry(this->OldSearchString.c_str());
          }
        }
      // switch advanced on/off
      else if ( key == 't' )
        {
        if (this->AdvancedMode)
          {
          this->AdvancedMode = false;
          }
        else
          {
          this->AdvancedMode = true;
          }
        getmaxyx(stdscr, y, x);
        this->RePost();
        this->Render(1, 1, x, y);
        }
      // generate and exit
      else if ( key == 'g' )
        {
        if ( this->OkToGenerate )
          {
          this->Generate();
          break;
          }
        }
      // delete cache entry
      else if ( key == 'd' && this->NumberOfVisibleEntries )
        {
        this->OkToGenerate = false;
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);

        // make the next or prev. current field after deletion
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the prev. entry is findex-5
        // and the label field for the next entry is findex+1
        // (findex always corresponds to the value field)
        FIELD* nextCur;
        if ( findex == 2 )
          {
          nextCur=0;
          }
        else if ( findex == 3*this->NumberOfVisibleEntries-1 )
          {
          nextCur = this->Fields[findex-5];
          }
        else
          {
          nextCur = this->Fields[findex+1];
          }

        // Get the label widget
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the is findex-2
        // (findex always corresponds to the value field)
        cmCursesWidget* lbl
          = reinterpret_cast<cmCursesWidget*>(
            field_userptr(this->Fields[findex-2]));
        if ( lbl )
          {
          this->CMakeInstance->GetState()->RemoveCacheEntry(lbl->GetValue());

          std::string nextVal;
          if (nextCur)
            {
            nextVal = (reinterpret_cast<cmCursesWidget*>(field_userptr(nextCur))->GetValue());
            }

          getmaxyx(stdscr, y, x);
          this->RemoveEntry(lbl->GetValue());
          this->RePost();
          this->Render(1, 1, x, y);

          if (nextCur)
            {
            // make the next or prev. current field after deletion
            nextCur = 0;
            std::vector<cmCursesCacheEntryComposite*>::iterator it;
            for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
              {
              if (nextVal == (*it)->Key)
                {
                nextCur = (*it)->Entry->Field;
                }
              }

            if (nextCur)
              {
              set_current_field(this->Form, nextCur);
              }
            }
          }
        }
      }

    touchwin(stdscr);
    wrefresh(stdscr);
    }
}